

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O0

void inproc_queue_run_closed(inproc_queue *queue)

{
  bool bVar1;
  nni_aio *local_18;
  nni_aio *aio;
  inproc_queue *queue_local;
  
  while( true ) {
    local_18 = (nni_aio *)nni_list_first(&queue->readers);
    bVar1 = true;
    if (local_18 == (nni_aio *)0x0) {
      local_18 = (nni_aio *)nni_list_first(&queue->writers);
      bVar1 = local_18 != (nni_aio *)0x0;
    }
    if (!bVar1) break;
    nni_aio_list_remove(local_18);
    nni_aio_finish_error(local_18,NNG_ECLOSED);
  }
  return;
}

Assistant:

static void
inproc_queue_run_closed(inproc_queue *queue)
{
	nni_aio *aio;
	while (((aio = nni_list_first(&queue->readers)) != NULL) ||
	    ((aio = nni_list_first(&queue->writers)) != NULL)) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
}